

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

char ** bcf_hdr_seqnames(bcf_hdr_t *h,int *n)

{
  char **ppcVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  char **ppcVar5;
  ulong uVar6;
  byte bVar7;
  long lVar8;
  ulong uVar9;
  
  puVar4 = (uint *)h->dict[1];
  uVar2 = puVar4[1];
  ppcVar5 = (char **)calloc((long)(int)uVar2,8);
  uVar3 = *puVar4;
  bVar7 = 0;
  lVar8 = 0x28;
  uVar9 = 0;
  do {
    if (uVar3 == uVar9) {
      uVar9 = 0;
      uVar6 = 0;
      if (0 < (int)uVar2) {
        uVar6 = (ulong)uVar2;
      }
      do {
        if (uVar6 == uVar9) {
          *n = uVar2;
          return ppcVar5;
        }
        ppcVar1 = ppcVar5 + uVar9;
        uVar9 = uVar9 + 1;
      } while (*ppcVar1 != (char *)0x0);
      __assert_fail("names[tid]",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                    ,0x548,"const char **bcf_hdr_seqnames(const bcf_hdr_t *, int *)");
    }
    if ((*(uint *)(*(long *)(puVar4 + 4) + (uVar9 >> 4 & 0xfffffff) * 4) >> (bVar7 & 0x1e) & 3) == 0
       ) {
      if ((int)uVar2 <= *(int *)(*(long *)(puVar4 + 8) + lVar8)) {
        __assert_fail("tid<m",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                      ,0x543,"const char **bcf_hdr_seqnames(const bcf_hdr_t *, int *)");
      }
      ppcVar5[*(int *)(*(long *)(puVar4 + 8) + lVar8)] =
           *(char **)(*(long *)(puVar4 + 6) + uVar9 * 8);
    }
    uVar9 = uVar9 + 1;
    bVar7 = bVar7 + 2;
    lVar8 = lVar8 + 0x30;
  } while( true );
}

Assistant:

const char **bcf_hdr_seqnames(const bcf_hdr_t *h, int *n)
{
    vdict_t *d = (vdict_t*)h->dict[BCF_DT_CTG];
    int tid, m = kh_size(d);
    const char **names = (const char**) calloc(m,sizeof(const char*));
    khint_t k;
    for (k=kh_begin(d); k<kh_end(d); k++)
    {
        if ( !kh_exist(d,k) ) continue;
        tid = kh_val(d,k).id;
        assert( tid<m );
        names[tid] = kh_key(d,k);
    }
    // sanity check: there should be no gaps
    for (tid=0; tid<m; tid++)
        assert(names[tid]);
    *n = m;
    return names;
}